

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelocDirWrapper.cpp
# Opt level: O0

void __thiscall RelocBlockWrapper::validatePage(RelocBlockWrapper *this)

{
  int iVar1;
  uint64_t uVar2;
  undefined4 extraout_var;
  offset_t pageRva;
  PEFile *pPStack_18;
  bool isOk;
  PEFile *m_PE;
  RelocBlockWrapper *this_local;
  
  this->isValidPage = false;
  if ((this->parentDir != (RelocDirWrapper *)0x0) &&
     (pPStack_18 = (this->parentDir->super_DataDirEntryWrapper).super_PENodeWrapper.m_PE,
     pPStack_18 != (PEFile *)0x0)) {
    pageRva._7_1_ = 0;
    m_PE = (PEFile *)this;
    uVar2 = ExeElementWrapper::getNumValue((ExeElementWrapper *)this,0,(bool *)((long)&pageRva + 7))
    ;
    if ((pageRva._7_1_ & 1) != 0) {
      iVar1 = (*(pPStack_18->super_MappedExe).super_Executable.super_AbstractByteBuffer.
                _vptr_AbstractByteBuffer[0x13])();
      this->isValidPage = (bool)(-(uVar2 < CONCAT44(extraout_var,iVar1)) & 1);
    }
  }
  return;
}

Assistant:

void RelocBlockWrapper::validatePage()
{
    this->isValidPage = false;
    if (!parentDir) return;
    PEFile *m_PE = parentDir->m_PE;
    if (!m_PE) return;

    bool isOk = false;
    const offset_t pageRva = this->getNumValue(RelocBlockWrapper::PAGE_VA, &isOk);
    if (!isOk) return;

    this->isValidPage = (pageRva < m_PE->getImageSize()) ? true : false;
}